

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

void SetMTChecksum(uchar *msg,int msglen)

{
  char cVar1;
  int local_18;
  uInt_MT checksum;
  int i;
  int msglen_local;
  uchar *msg_local;
  
  cVar1 = '\0';
  for (local_18 = 1; local_18 < msglen + -1; local_18 = local_18 + 1) {
    cVar1 = msg[local_18] + cVar1;
  }
  msg[msglen + -1] = -cVar1;
  return;
}

Assistant:

inline void SetMTChecksum(unsigned char* msg, int msglen)
{
	int i = 0;
	uInt_MT checksum;

	// If all message bytes excluding the preamble are summed and the lower byte value 
	// of the result equals zero, the message is valid and it may be processed. The 
	// checksum value of the message should be included in the summation.
	checksum.v = 0;
	for (i = 1; i < msglen-1; i++)
	{
		checksum.v += msg[i];
	}
	msg[msglen-1] = (unsigned char)(256-(int)checksum.c[0]);
}